

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_info.c
# Opt level: O1

char * rmf_fileInfo_base_name(rmf_fileInfo_t *self)

{
  uint8_t *pBegin;
  uint8_t *pEnd;
  char *pcVar1;
  
  if (self != (rmf_fileInfo_t *)0x0) {
    pBegin = (uint8_t *)adt_str_cstr(&self->name);
    pEnd = (uint8_t *)strchr((char *)pBegin,0x2e);
    if (pEnd != (uint8_t *)0x0) {
      pcVar1 = bstr_make_cstr(pBegin,pEnd);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

char* rmf_fileInfo_base_name(rmf_fileInfo_t const* self)
{
   if ( (self != NULL))
   {
      char const* name = adt_str_cstr((adt_str_t*)&self->name);
      char *dot = strchr(name, '.');
      if (dot != 0)
      {
         return bstr_make_cstr((const uint8_t*) name, (const uint8_t*) dot);
      }
   }
   return (char*) 0;
}